

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::fastPresolveLoop(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  Result RVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar4._0_4_ = this->model->num_col_;
  uVar4._4_4_ = this->model->num_row_;
  iVar1 = this->numDeletedRows;
  iVar5 = this->numDeletedCols;
  while( true ) {
    this->oldNumCol = (int)uVar4 - iVar5;
    this->oldNumRow = (int)((ulong)uVar4 >> 0x20) - iVar1;
    RVar8 = removeRowSingletons(this,postsolve_stack);
    if (RVar8 != kOk) {
      return RVar8;
    }
    RVar8 = presolveChangedRows(this,postsolve_stack);
    if (RVar8 != kOk) {
      return RVar8;
    }
    RVar8 = removeDoubletonEquations(this,postsolve_stack);
    if (RVar8 != kOk) {
      return RVar8;
    }
    RVar8 = presolveColSingletons(this,postsolve_stack);
    if (RVar8 != kOk) break;
    RVar8 = presolveChangedCols(this,postsolve_stack);
    if (RVar8 != kOk) {
      return RVar8;
    }
    uVar2 = this->oldNumCol;
    uVar6 = this->oldNumRow;
    uVar4._0_4_ = this->model->num_col_;
    uVar4._4_4_ = this->model->num_row_;
    uVar3 = this->numDeletedRows;
    uVar7 = this->numDeletedCols;
    auVar10._0_8_ = (double)(int)((uVar2 - (undefined4)uVar4) + uVar7) * 100.0;
    auVar10._8_8_ = (double)(int)((uVar6 - uVar4._4_4_) + uVar3) * 100.0;
    auVar11._8_8_ = (double)(int)uVar6;
    auVar11._0_8_ = (double)(int)uVar2;
    auVar11 = divpd(auVar10,auVar11);
    dVar9 = auVar11._0_8_;
    if (auVar11._0_8_ <= auVar11._8_8_) {
      dVar9 = auVar11._8_8_;
    }
    iVar5 = uVar7;
    iVar1 = uVar3;
    if (dVar9 <= 0.01) {
      return kOk;
    }
  }
  return RVar8;
}

Assistant:

HPresolve::Result HPresolve::fastPresolveLoop(
    HighsPostsolveStack& postsolve_stack) {
  do {
    storeCurrentProblemSize();

    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedRows(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(removeDoubletonEquations(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveColSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedCols(postsolve_stack));

  } while (problemSizeReduction() > 0.01);

  return Result::kOk;
}